

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidgetPrivate::showMonth(QCalendarWidgetPrivate *this,int year,int month)

{
  int in_EDX;
  int in_ESI;
  QCalendarWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QCalendarWidget *q;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  QSize local_10;
  QCalendarWidgetPrivate *this_00;
  
  this_00 = *(QCalendarWidgetPrivate **)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_model->m_shownYear != in_ESI) || (in_RDI->m_model->m_shownMonth != in_EDX)) {
    q_func(in_RDI);
    QtPrivate::QCalendarModel::showMonth
              ((QCalendarModel *)in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    updateNavigationBar(this_00);
    QCalendarWidget::currentPageChanged
              ((QCalendarWidget *)0x51c75e,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    QtPrivate::QCalendarView::internalUpdate((QCalendarView *)0x51c76f);
    QSize::QSize((QSize *)in_RDI);
    in_RDI->cachedSizeHint = local_10;
    update((QCalendarWidgetPrivate *)CONCAT44(in_ESI,in_EDX));
    updateMonthMenu(this_00);
  }
  if (*(QCalendarWidgetPrivate **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarWidgetPrivate::showMonth(int year, int month)
{
    if (m_model->m_shownYear == year && m_model->m_shownMonth == month)
        return;
    Q_Q(QCalendarWidget);
    m_model->showMonth(year, month);
    updateNavigationBar();
    emit q->currentPageChanged(year, month);
    m_view->internalUpdate();
    cachedSizeHint = QSize();
    update();
    updateMonthMenu();
}